

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
BayesianGameCollaborativeGraphical::RestrictIndividualIndicesToScope<unsigned_int>
          (BayesianGameCollaborativeGraphical *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indivIndices,Index LRF)

{
  allocator_type *__a;
  uint in_ECX;
  long in_RSI;
  Scope *in_RDI;
  Scope agSc;
  Index e;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *restr;
  Scope *pSVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffb0;
  undefined1 local_3a [58];
  
  std::vector<Scope,_std::allocator<Scope>_>::operator[]
            ((vector<Scope,_std::allocator<Scope>_> *)(in_RSI + 0xf8),(ulong)in_ECX);
  pSVar1 = (Scope *)(local_3a + 2);
  Scope::Scope(pSVar1,in_RDI);
  local_3a[1] = 0;
  __a = (allocator_type *)
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&pSVar1->super_SDT);
  pSVar1 = (Scope *)local_3a;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x8b2767);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffffb0,(size_type)pSVar1,__a);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x8b2787);
  IndexTools::RestrictIndividualIndicesToScope<unsigned_int>
            (in_stack_ffffffffffffffb0,pSVar1,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)__a);
  local_3a[1] = 1;
  Scope::~Scope((Scope *)0x8b27f3);
  return &in_RDI->super_SDT;
}

Assistant:

typename std::vector<T> 
BayesianGameCollaborativeGraphical::RestrictIndividualIndicesToScope(const std::vector<T> &indivIndices, Index LRF) const
{
    Index e = LRF;
    Scope agSc = _m_agentScopes[e];
    std::vector<T> restr(agSc.size());
    IndexTools::RestrictIndividualIndicesToScope(indivIndices, agSc, restr);
    return(restr);
}